

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateHandle
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handleData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedHandles)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Base_ptr p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  long lVar11;
  VulkanHppGenerator *this_00;
  undefined8 uVar12;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string strippedValue_1;
  string typesafeExplicitKeyword;
  string strippedValue;
  string typesafeConversionConditional;
  string typesafeConversionConditionalEnd;
  string className;
  string usingAlias;
  string cppType;
  string debugReportObjectType;
  string commands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator_type local_582;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string *local_540;
  VulkanHppGenerator *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  long *local_510;
  size_type local_508;
  long local_500 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  _Base_ptr local_490;
  string *local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_440;
  _Rb_tree_node_base *local_438;
  string local_430;
  string local_410;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  string local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&listedHandles->_M_t,&handleData->first);
  if ((_Rb_tree_header *)cVar5._M_node != &(listedHandles->_M_t)._M_impl.super__Rb_tree_header) {
    __assert_fail("!listedHandles.contains( handleData.first )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x1f27,
                  "std::string VulkanHppGenerator::generateHandle(const std::pair<std::string, HandleData> &, std::set<std::string> &) const"
                 );
  }
  generateHandleDependencies(__return_storage_ptr__,this,handleData,listedHandles);
  if ((handleData->first)._M_string_length == 0) {
    generateHandleEmpty_abi_cxx11_((string *)&local_390,this,&handleData->second);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(char *)local_390._M_allocated_capacity,local_390._8_8_);
    local_3b0.field_2._M_allocated_capacity = local_380._M_allocated_capacity;
    local_3b0._M_dataplus._M_p = (pointer)local_390._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_allocated_capacity == &local_380) goto LAB_00185150;
  }
  else {
    generateHandleCommandDeclarations(&local_3b0,this,&(handleData->second).commands);
    local_488 = &(handleData->second).objTypeEnum;
    generateDebugReportObjectType(&local_430,this,local_488);
    local_390._M_allocated_capacity = (size_type)&local_380;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"Vk","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    pcVar1 = (handleData->first)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4b0,pcVar1,pcVar1 + (handleData->first)._M_string_length);
    uVar12 = local_390._8_8_;
    if (((ulong)local_390._8_8_ <= local_4b0._M_string_length) &&
       ((local_390._8_8_ == 0 ||
        (iVar4 = bcmp(local_4b0._M_dataplus._M_p,(void *)local_390._M_allocated_capacity,
                      local_390._8_8_), iVar4 == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_4b0,0,uVar12);
    }
    local_538 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_allocated_capacity != &local_380) {
      operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1);
    }
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    local_460._M_string_length = 0;
    local_460.field_2._M_local_buf[0] = '\0';
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_430,"eUnknown");
    if (iVar4 != 0) {
      if ((generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
           ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                                       ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_),
         iVar4 != 0)) {
        generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
        ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_._M_dataplus._M_p =
             (pointer)&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                       ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                    ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_,
                   "\n  template <>\n  struct CppType<VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT, VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::e${className}>\n  {\n    using Type = VULKAN_HPP_NAMESPACE::${className};\n  };\n"
                   ,"");
        __cxa_atexit(std::__cxx11::string::~string,
                     &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                      ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                             ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_390,(char (*) [10])"className",&local_4b0);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_390;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_60,__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_480,(allocator_type *)&local_580);
      replaceWithMap(&local_3f0.first,
                     &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                      ::cppTypeFromDebugReportObjectTypeEXTTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_60);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_460,&local_3f0.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.first._M_dataplus._M_p != &local_3f0.first.field_2) {
        operator_delete(local_3f0.first._M_dataplus._M_p,
                        local_3f0.first.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      if (local_370 != &local_360) {
        operator_delete(local_370,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_allocated_capacity != &local_380) {
        operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1)
        ;
      }
    }
    this_00 = local_538;
    getProtectFromType((string *)&local_390,local_538,&handleData->first);
    generateProtection(&local_3f0,this_00,(string *)&local_390,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_allocated_capacity != &local_380) {
      operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1);
    }
    if ((handleData->second).objTypeEnum._M_string_length == 0) {
      __assert_fail("!handleData.second.objTypeEnum.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x1f4a,
                    "std::string VulkanHppGenerator::generateHandle(const std::pair<std::string, HandleData> &, std::set<std::string> &) const"
                   );
    }
    local_390._M_allocated_capacity = (size_type)&local_380;
    local_440 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)listedHandles;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"VkObjectType","");
    local_490 = (_Base_ptr)
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                ::find(&(local_538->m_enums)._M_t,(key_type *)&local_390);
    uVar12 = local_390._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_allocated_capacity != &local_380) {
      operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)local_490 == &(local_538->m_enums)._M_t._M_impl.super__Rb_tree_header) {
      __assert_fail("enumIt != m_enums.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x1f4c,
                    "std::string VulkanHppGenerator::generateHandle(const std::pair<std::string, HandleData> &, std::set<std::string> &) const"
                   );
    }
    local_540 = __return_storage_ptr__;
    bVar3 = contains((VulkanHppGenerator *)uVar12,
                     (vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                      *)&local_490[5]._M_left,local_488);
    if (!bVar3) {
      __assert_fail("contains( enumIt->second.values, handleData.second.objTypeEnum )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x1f4d,
                    "std::string VulkanHppGenerator::generateHandle(const std::pair<std::string, HandleData> &, std::set<std::string> &) const"
                   );
    }
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    local_480._M_string_length = 0;
    local_480.field_2._M_local_buf[0] = '\0';
    p_Var7 = (handleData->second).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_438 = &(handleData->second).aliases._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var7 != local_438) {
      paVar14 = &local_530.field_2;
      do {
        local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Vk","");
        local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_560,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        sVar2 = local_4d0._M_string_length;
        if ((local_4d0._M_string_length <= local_560._M_string_length) &&
           ((local_4d0._M_string_length == 0 ||
            (iVar4 = bcmp(local_560._M_dataplus._M_p,local_4d0._M_dataplus._M_p,
                          local_4d0._M_string_length), iVar4 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&local_560,0,sVar2);
        }
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_560,0,0,"  using ",8);
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar8 = &pbVar6->field_2;
        if (paVar9 == paVar8) {
          local_4f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_4f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_4f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_4f0._M_dataplus._M_p = (pointer)paVar9;
        }
        local_4f0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_4f0," = ");
        local_530._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p == paVar9) {
          local_530.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_530.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
          local_530.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
          local_530._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_530.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_530._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        local_510 = local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"Vk","");
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        pcVar1 = (handleData->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5a8,pcVar1,pcVar1 + (handleData->first)._M_string_length);
        sVar2 = local_508;
        if ((local_508 <= local_5a8._M_string_length) &&
           ((local_508 == 0 ||
            (iVar4 = bcmp(local_5a8._M_dataplus._M_p,local_510,local_508), iVar4 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&local_5a8,0,sVar2);
        }
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != paVar14) {
          uVar12 = local_530.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_5a8._M_string_length + local_530._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
            uVar12 = local_5a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_5a8._M_string_length + local_530._M_string_length)
          goto LAB_0018498c;
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_5a8,0,0,local_530._M_dataplus._M_p,local_530._M_string_length);
        }
        else {
LAB_0018498c:
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_530,local_5a8._M_dataplus._M_p,local_5a8._M_string_length);
        }
        local_580._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p == paVar9) {
          local_580.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_580.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        }
        else {
          local_580.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_580._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_580,";\n");
        local_390._M_allocated_capacity = (size_type)&local_380;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar8 = &pbVar6->field_2;
        if (paVar9 == paVar8) {
          local_380._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_380._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_380._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_390._M_allocated_capacity = (size_type)paVar9;
        }
        local_390._8_8_ = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_480,(char *)local_390._M_allocated_capacity,local_390._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_allocated_capacity != &local_380) {
          operator_delete((void *)local_390._M_allocated_capacity,
                          local_380._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        if (local_510 != local_500) {
          operator_delete(local_510,local_500[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != paVar14) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != local_438);
    }
    bVar3 = (handleData->second).isDispatchable;
    pcVar13 = "VULKAN_HPP_TYPESAFE_EXPLICIT ";
    if (bVar3 != false) {
      pcVar13 = "";
    }
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    pcVar10 = pcVar13 + 0x1d;
    if (bVar3 != false) {
      pcVar10 = pcVar13;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,pcVar13,pcVar10);
    bVar3 = (handleData->second).isDispatchable;
    pcVar13 = "#if ( VULKAN_HPP_TYPESAFE_CONVERSION == 1 )\n";
    if (bVar3 != false) {
      pcVar13 = "";
    }
    pcVar10 = pcVar13 + 0x2c;
    if (bVar3 != false) {
      pcVar10 = pcVar13;
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,pcVar13,pcVar10);
    bVar3 = (handleData->second).isDispatchable;
    pcVar13 = "#endif\n";
    if (bVar3 != false) {
      pcVar13 = "";
    }
    pcVar10 = pcVar13 + 7;
    if (bVar3 != false) {
      pcVar10 = pcVar13;
    }
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,pcVar13,pcVar10);
    if ((generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
         ::templateString_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                                     ::templateString_abi_cxx11_), iVar4 != 0)) {
      generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::templateString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                     ::templateString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::templateString_abi_cxx11_,
                 "\n  // wrapper class for handle Vk${className}, see https://registry.khronos.org/vulkan/specs/latest/man/html/Vk${className}.html\n${enter}  class ${className}\n  {\n  public:\n    using CType = Vk${className};\n    using NativeType = Vk${className};\n\n    static VULKAN_HPP_CONST_OR_CONSTEXPR VULKAN_HPP_NAMESPACE::ObjectType objectType = VULKAN_HPP_NAMESPACE::ObjectType::${objTypeEnum};\n    static VULKAN_HPP_CONST_OR_CONSTEXPR VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT debugReportObjectType = VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::${debugReportObjectType};\n\n  public:\n    ${className}() VULKAN_HPP_NOEXCEPT {}    // = default; - try to workaround a compiler issue\n    ${className}( ${className} const & rhs ) = default;\n    ${className} & operator=( ${className} const & rhs ) = default;\n\n#if !defined(VULKAN_HPP_HANDLES_MOVE_EXCHANGE)\n    ${className}( ${className} && rhs ) = default;\n    ${className} & operator=( ${className} && rhs ) = default;\n#else\n    ${className}( ${className} && rhs ) VULKAN_HPP_NOEXCEPT\n      : m_${memberName}( VULKAN_HPP_NAMESPACE::exchange( rhs.m_${memberName}, {} ) )\n    {}\n    ${className} & operator=( ${className} && rhs ) VULKAN_HPP_NOEXCEPT\n    {\n      m_${memberName} = VULKAN_HPP_NAMESPACE::exchange( rhs.m_${memberName}, {} );\n      return *this;\n    }\n#endif\n\n    VULKAN_HPP_CONSTEXPR ${className}( std::nullptr_t ) VULKAN_HPP_NOEXCEPT\n    {}\n    ${typesafeExplicitKeyword}${className}( Vk${className} ${memberName} ) VULKAN_HPP_NOEXCEPT\n      : m_${memberName}( ${memberName} )\n    {}\n\n${typesafeConversionConditional}    ${className} & operator=(Vk${className} ${memberName}) VULKAN_HPP_NOEXCEPT\n    {\n      m_${memberName} = ${memberName};\n      return *this;\n    }\n${typesafeConversionConditionalEnd}\n    ${className} & operator=( std::nullptr_t ) VULKAN_HPP_NOEXCEPT\n    {\n      m_${memberName} = {};\n      return *this;\n    }\n\n    ${commands}\n    ${typesafeExplicitKeyword}operator Vk${className}() const VULKAN_HPP_NOEXCEPT\n    {\n      return m_${memberName};\n    }\n\n    explicit operat..." /* TRUNCATED STRING LITERAL */
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                    ::templateString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                           ::templateString_abi_cxx11_);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_390,(char (*) [10])"className",&local_4b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_350,(char (*) [9])"commands",&local_3b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_310,(char (*) [8])"CppType",&local_460);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2d0,(char (*) [22])"debugReportObjectType",&local_430);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_290,(char (*) [6])"enter",&local_3f0.first);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_250,(char (*) [6])"leave",&local_3f0.second);
    local_510 = local_500;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"Vk","");
    pcVar1 = (handleData->first)._M_dataplus._M_p;
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,pcVar1,pcVar1 + (handleData->first)._M_string_length);
    if ((local_508 <= local_5a8._M_string_length) &&
       ((local_508 == 0 ||
        (iVar4 = bcmp(local_5a8._M_dataplus._M_p,local_510,local_508), iVar4 == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_5a8,0,local_508);
    }
    anon_unknown.dwarf_1900a8::startLowerCase(&local_4d0,&local_5a8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_210,(char (*) [11])"memberName",&local_4d0);
    generateEnumValueName(&local_410,local_538,(string *)(local_490 + 1),local_488,false);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1d0,(char (*) [12])"objTypeEnum",&local_410);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_190,(char (*) [11])"usingAlias",&local_480);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[24],_true>(&local_150,(char (*) [24])"typesafeExplicitKeyword",&local_580)
    ;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[30],_true>
              (&local_110,(char (*) [30])"typesafeConversionConditional",&local_530);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[33],_true>
              (&local_d0,(char (*) [33])"typesafeConversionConditionalEnd",&local_4f0);
    __l._M_len = 0xc;
    __l._M_array = (iterator)&local_390;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_90,__l,&local_581,&local_582);
    replaceWithMap(&local_560,
                   &generateHandle(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                    ::templateString_abi_cxx11_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (local_540,local_560._M_dataplus._M_p,local_560._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    lVar11 = -0x300;
    paVar14 = &local_d0.second.field_2;
    do {
      if (paVar14 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar14->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar14->_M_allocated_capacity)[-2],
                        paVar14->_M_allocated_capacity + 1);
      }
      if (&paVar14->_M_allocated_capacity + -4 != (size_type *)(&paVar14->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar14->_M_allocated_capacity)[-6],
                        (&paVar14->_M_allocated_capacity)[-4] + 1);
      }
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar14->_M_allocated_capacity + -8);
      lVar11 = lVar11 + 0x40;
    } while (lVar11 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    listedHandles =
         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_440;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_540;
    if (local_510 != local_500) {
      operator_delete(local_510,local_500[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,
                      CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                               local_480.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.second._M_dataplus._M_p != &local_3f0.second.field_2) {
      operator_delete(local_3f0.second._M_dataplus._M_p,
                      local_3f0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.first._M_dataplus._M_p != &local_3f0.first.field_2) {
      operator_delete(local_3f0.first._M_dataplus._M_p,
                      local_3f0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                               local_460.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p == &local_3b0.field_2) goto LAB_00185150;
  }
  operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
LAB_00185150:
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)listedHandles,&handleData->first);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateHandle( std::pair<std::string, HandleData> const & handleData, std::set<std::string> & listedHandles ) const
{
  assert( !listedHandles.contains( handleData.first ) );

  // first check for any handle that needs to be listed before this one
  std::string str = generateHandleDependencies( handleData, listedHandles );

  // list the commands of this handle
  if ( handleData.first.empty() )
  {
    // the free functions, not bound to any handle
    str += generateHandleEmpty( handleData.second );
  }
  else
  {
    // list all the commands that are mapped to members of this class
    std::string commands = generateHandleCommandDeclarations( handleData.second.commands );

    std::string debugReportObjectType = generateDebugReportObjectType( handleData.second.objTypeEnum );

    // create CPPType template specialization
    std::string className = stripPrefix( handleData.first, "Vk" );
    std::string cppType;
    if ( debugReportObjectType != "eUnknown" )
    {
      static const std::string cppTypeFromDebugReportObjectTypeEXTTemplate = R"(
  template <>
  struct CppType<VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT, VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::e${className}>
  {
    using Type = VULKAN_HPP_NAMESPACE::${className};
  };
)";
      cppType = replaceWithMap( cppTypeFromDebugReportObjectTypeEXTTemplate, { { "className", className } } );
    }

    auto [enter, leave] = generateProtection( getProtectFromType( handleData.first ) );

    assert( !handleData.second.objTypeEnum.empty() );
    auto enumIt = m_enums.find( "VkObjectType" );
    assert( enumIt != m_enums.end() );
    assert( contains( enumIt->second.values, handleData.second.objTypeEnum ) );

    std::string usingAlias;
    for ( auto const & alias : handleData.second.aliases )
    {
      usingAlias += "  using " + stripPrefix( alias.first, "Vk" ) + " = " + stripPrefix( handleData.first, "Vk" ) + ";\n";
    }

    const std::string typesafeExplicitKeyword          = handleData.second.isDispatchable ? "" : "VULKAN_HPP_TYPESAFE_EXPLICIT ";
    const std::string typesafeConversionConditional    = handleData.second.isDispatchable ? "" : "#if ( VULKAN_HPP_TYPESAFE_CONVERSION == 1 )\n";
    const std::string typesafeConversionConditionalEnd = handleData.second.isDispatchable ? "" : "#endif\n";

    static const std::string templateString = R"(
  // wrapper class for handle Vk${className}, see https://registry.khronos.org/vulkan/specs/latest/man/html/Vk${className}.html
${enter}  class ${className}
  {
  public:
    using CType = Vk${className};
    using NativeType = Vk${className};

    static VULKAN_HPP_CONST_OR_CONSTEXPR VULKAN_HPP_NAMESPACE::ObjectType objectType = VULKAN_HPP_NAMESPACE::ObjectType::${objTypeEnum};
    static VULKAN_HPP_CONST_OR_CONSTEXPR VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT debugReportObjectType = VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::${debugReportObjectType};

  public:
    ${className}() VULKAN_HPP_NOEXCEPT {}    // = default; - try to workaround a compiler issue
    ${className}( ${className} const & rhs ) = default;
    ${className} & operator=( ${className} const & rhs ) = default;

#if !defined(VULKAN_HPP_HANDLES_MOVE_EXCHANGE)
    ${className}( ${className} && rhs ) = default;
    ${className} & operator=( ${className} && rhs ) = default;
#else
    ${className}( ${className} && rhs ) VULKAN_HPP_NOEXCEPT
      : m_${memberName}( VULKAN_HPP_NAMESPACE::exchange( rhs.m_${memberName}, {} ) )
    {}
    ${className} & operator=( ${className} && rhs ) VULKAN_HPP_NOEXCEPT
    {
      m_${memberName} = VULKAN_HPP_NAMESPACE::exchange( rhs.m_${memberName}, {} );
      return *this;
    }
#endif

    VULKAN_HPP_CONSTEXPR ${className}( std::nullptr_t ) VULKAN_HPP_NOEXCEPT
    {}
    ${typesafeExplicitKeyword}${className}( Vk${className} ${memberName} ) VULKAN_HPP_NOEXCEPT
      : m_${memberName}( ${memberName} )
    {}

${typesafeConversionConditional}    ${className} & operator=(Vk${className} ${memberName}) VULKAN_HPP_NOEXCEPT
    {
      m_${memberName} = ${memberName};
      return *this;
    }
${typesafeConversionConditionalEnd}
    ${className} & operator=( std::nullptr_t ) VULKAN_HPP_NOEXCEPT
    {
      m_${memberName} = {};
      return *this;
    }

    ${commands}
    ${typesafeExplicitKeyword}operator Vk${className}() const VULKAN_HPP_NOEXCEPT
    {
      return m_${memberName};
    }

    explicit operator bool() const VULKAN_HPP_NOEXCEPT
    {
      return m_${memberName} != VK_NULL_HANDLE;
    }

    bool operator!() const VULKAN_HPP_NOEXCEPT
    {
      return m_${memberName} == VK_NULL_HANDLE;
    }

  private:
    Vk${className} m_${memberName} = {};
  };

  template <>
  struct CppType<VULKAN_HPP_NAMESPACE::ObjectType, VULKAN_HPP_NAMESPACE::ObjectType::${objTypeEnum}>
  {
    using Type = VULKAN_HPP_NAMESPACE::${className};
  };

${CppType}

#if ( VK_USE_64_BIT_PTR_DEFINES == 1 )
  template <>
  struct CppType<Vk${className}, VK_NULL_HANDLE>
  {
    using Type = VULKAN_HPP_NAMESPACE::${className};
  };
#endif

  template <>
  struct isVulkanHandleType<VULKAN_HPP_NAMESPACE::${className}>
  {
    static VULKAN_HPP_CONST_OR_CONSTEXPR bool value = true;
  };
${usingAlias}${leave})";

    str += replaceWithMap( templateString,
                           { { "className", className },
                             { "commands", commands },
                             { "CppType", cppType },
                             { "debugReportObjectType", debugReportObjectType },
                             { "enter", enter },
                             { "leave", leave },
                             { "memberName", startLowerCase( stripPrefix( handleData.first, "Vk" ) ) },
                             { "objTypeEnum", generateEnumValueName( enumIt->first, handleData.second.objTypeEnum, false ) },
                             { "usingAlias", usingAlias },
                             { "typesafeExplicitKeyword", typesafeExplicitKeyword },
                             { "typesafeConversionConditional", typesafeConversionConditional },
                             { "typesafeConversionConditionalEnd", typesafeConversionConditionalEnd } } );
  }

  listedHandles.insert( handleData.first );
  return str;
}